

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstack.cc
# Opt level: O2

int anon_unknown.dwarf_15934::usage(ostream *os,char *name,Flags *options)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"usage: ");
  poVar1 = std::operator<<(poVar1,name);
  std::operator<<(poVar1,
                  " <[ exe ] <PID | core> >+\n\nprint a stack trace of PID or core. If specified, assume image was created from\n execing `exe`, otherwise, the executable is inferred from the process or core\n\navailable options:\n"
                 );
  poVar1 = (ostream *)::pstack::Flags::dump((ostream *)options);
  poVar1 = std::operator<<(poVar1,"\n");
  return (int)poVar1;
}

Assistant:

int
usage(std::ostream &os, const char *name, const Flags &options)
{
     os <<
"usage: " << name << " <[ exe ] <PID | core> >+\n"
"\n"
"print a stack trace of PID or core. If specified, assume image was created from\n"
" execing `exe`, otherwise, the executable is inferred from the process or core\n"
"\n"
"available options:\n" << options <<  "\n";
     return EX_USAGE;
}